

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TorsionTypeParser.cpp
# Opt level: O0

TorsionType * __thiscall
OpenMD::TorsionTypeParser::parseTypeAndPars
          (TorsionTypeParser *this,string *type,vector<double,_std::allocator<double>_> *pars)

{
  bool bVar1;
  TorsionType *pTVar2;
  double in_RDX;
  string *in_RSI;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *in_RDI;
  iterator it;
  string line;
  string *in_stack_000004e8;
  TorsionTypeParser *in_stack_000004f0;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff68;
  string local_80 [48];
  double *local_50;
  double *local_48;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_40;
  string local_38 [56];
  
  std::__cxx11::string::string(local_38,in_RSI);
  __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
  __normal_iterator(&local_40);
  local_48 = (double *)
             std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff68);
  local_40._M_current = local_48;
  while( true ) {
    local_50 = (double *)
               std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff68);
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                               *)in_stack_ffffffffffffff68);
    if (!bVar1) break;
    std::__cxx11::string::append((char *)local_38);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::operator*
              (&local_40);
    std::__cxx11::to_string(in_RDX);
    std::__cxx11::string::append(local_38);
    std::__cxx11::string::~string(local_80);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_40);
  }
  pTVar2 = parseLine(in_stack_000004f0,in_stack_000004e8);
  std::__cxx11::string::~string(local_38);
  return pTVar2;
}

Assistant:

TorsionType* TorsionTypeParser::parseTypeAndPars(const std::string& type,
                                                   std::vector<RealType> pars) {
    std::string line(type);

    std::vector<RealType>::iterator it;
    for (it = pars.begin(); it != pars.end(); ++it) {
      line.append("\t");
      line.append(std::to_string(*it));
    }

    return parseLine(line);
  }